

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.h
# Opt level: O0

void SerializeMany<HashWriter,int,uint256,uint256,unsigned_int,unsigned_int,unsigned_int>
               (HashWriter *s,int *args,uint256 *args_1,uint256 *args_2,uint *args_3,uint *args_4,
               uint *args_5)

{
  long lVar1;
  HashWriter *in_R9;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  Serialize<HashWriter>(in_R9,0);
  Serialize<HashWriter,_uint256>(in_R9,(uint256 *)0xe80968);
  Serialize<HashWriter,_uint256>(in_R9,(uint256 *)0xe80977);
  Serialize<HashWriter>(in_R9,0);
  Serialize<HashWriter>(in_R9,0);
  Serialize<HashWriter>(in_R9,0);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SerializeMany(Stream& s, const Args&... args)
{
    (::Serialize(s, args), ...);
}